

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ap.c
# Opt level: O0

int parse_command(AP_CTX *ctx,char *line,BOOL *command_match)

{
  int iVar1;
  char *invalid_chars;
  int rc;
  BOOL *command_match_local;
  char *line_local;
  AP_CTX *ctx_local;
  
  *command_match = '\0';
  iVar1 = ap_str_match(ctx->client_command,line,";{}|`()&");
  if (iVar1 == 0) {
    ap_log(AP_LOG_LEVEL_DEBUG,"(%s) Command matched by config line \'%s\'\n",ctx->client_ip,line);
    *command_match = '\x01';
  }
  else if (iVar1 == 0x10) {
    ap_log(AP_LOG_LEVEL_DEBUG,
           "(%s) Invalid characters \'%s\' in command \'%s\', not allowed in the substring matched by \'*\'\n"
           ,ctx->client_ip,";{}|`()&",ctx->client_command);
  }
  else {
    ap_log(AP_LOG_LEVEL_DEBUG,"(%s) Command doesn\'t match\n",ctx->client_ip);
  }
  return 0;
}

Assistant:

static int parse_command (AP_CTX *ctx, char *line, BOOL *command_match)
{
	int			rc				= AP_NO_ERROR;
	const char	*invalid_chars	= ";{}|`()&";
	
	*command_match = FALSE;

	rc = ap_str_match (ctx->client_command, line, invalid_chars);
	if (rc != AP_NO_ERROR)
	{
		switch (rc)
		{
			case AP_ERROR_STR_INVALID_CHARS:
			{
				ap_debug ("(%s) Invalid characters '%s' in command '%s', not allowed in the substring matched by '*'\n", ctx->client_ip, invalid_chars, ctx->client_command);
				rc = AP_NO_ERROR;

				goto finish;

				break;
			}

			default:
			{
				ap_debug ("(%s) Command doesn't match\n", ctx->client_ip);

				rc = AP_NO_ERROR;

				goto finish;

				break;
			}
		}
	}

	ap_debug ("(%s) Command matched by config line '%s'\n", ctx->client_ip, line);
	*command_match = TRUE;
	
finish:
	return rc;
}